

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()(DescribeWalletAddressVisitor *this,PKHash *pkhash)

{
  byte bVar1;
  UniValue *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  CPubKey vchPubKey;
  CKeyID keyID;
  UniValue *in_stack_fffffffffffffdc8;
  CPubKey *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  UniValue *in_stack_fffffffffffffde8;
  UniValue *this_00;
  UniValue *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  allocator<char> local_1b1;
  Span<const_unsigned_char> in_stack_fffffffffffffe50;
  allocator<char> local_199 [280];
  undefined1 local_81 [65];
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  ToKeyID((PKHash *)in_stack_fffffffffffffde0);
  this_01 = (UniValue *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string(in_stack_fffffffffffffde0);
  UniValue::UniValue(in_stack_fffffffffffffde8,(VType)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                     (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdc8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdc8);
  if ((*(long *)in_RSI != 0) &&
     (bVar1 = (**(code **)(**(long **)in_RSI + 0x20))
                        (*(long **)in_RSI,&stack0xffffffffffffffe4,local_81), (bVar1 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe18,(char *)this_01,(allocator<char> *)this_00);
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    HexStr_abi_cxx11_(in_stack_fffffffffffffe50);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    UniValue::pushKV(this_01,(string *)this_00,in_RSI);
    UniValue::~UniValue(in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    std::allocator<char>::~allocator(local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe18,(char *)this_01,(allocator<char> *)this_00);
    CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffdc8);
    UniValue::UniValue<bool,_bool,_true>(this_00,(bool *)in_RSI);
    UniValue::pushKV(this_01,(string *)this_00,in_RSI);
    UniValue::~UniValue(in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    std::allocator<char>::~allocator(&local_1b1);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const PKHash& pkhash) const
    {
        CKeyID keyID{ToKeyID(pkhash)};
        UniValue obj(UniValue::VOBJ);
        CPubKey vchPubKey;
        if (provider && provider->GetPubKey(keyID, vchPubKey)) {
            obj.pushKV("pubkey", HexStr(vchPubKey));
            obj.pushKV("iscompressed", vchPubKey.IsCompressed());
        }
        return obj;
    }